

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.h
# Opt level: O0

void __thiscall SQFuncState::AddDefaultParam(SQFuncState *this,SQInteger trg)

{
  SQInteger local_18;
  SQInteger trg_local;
  SQFuncState *this_local;
  
  local_18 = trg;
  trg_local = (SQInteger)this;
  sqvector<long_long>::push_back(&this->_defaultparams,&local_18);
  return;
}

Assistant:

void AddDefaultParam(SQInteger trg) { _defaultparams.push_back(trg); }